

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O1

void __thiscall
level_mesh::merge_orphans
          (level_mesh *this,b_submesh_vec *orphans,size_t num_groups,bool consider_gamemtl)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  pointer ppbVar14;
  b_submesh *instance1;
  pointer pbVar15;
  pointer pbVar16;
  pointer p_Var17;
  pointer ppbVar18;
  long lVar19;
  b_face_vec_it it1;
  pointer pbVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  pointer ppbVar24;
  uint uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  
  ppbVar24 = (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppbVar14 = (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppbVar24 != ppbVar14) {
    xray_re::msg("merging %Iu orphan(s)",(long)ppbVar14 - (long)ppbVar24 >> 3);
    ppbVar24 = (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    ppbVar14 = (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    if (ppbVar24 != ppbVar14) {
      uVar10 = this->m_free_tag;
      do {
        instance1 = *ppbVar24;
        pbVar15 = (this->super_xr_mesh_builder).m_faces.
                  super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar16 = (this->super_xr_mesh_builder).m_faces.
                  super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar15 == pbVar16) {
          uVar25 = 0xffffffff;
          fVar26 = 3.4028235e+38;
          fVar30 = 3.4028235e+38;
          uVar21 = 0xffffffff;
        }
        else {
          uVar22 = (ulong)(instance1->super_b_model_instance).min_face;
          p_Var17 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
                    super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar19 = uVar22 * 0x40;
          uVar25 = pbVar15[uVar22].field_0.field_0.v[0];
          uVar21 = pbVar15[uVar22].field_0.field_0.v[1];
          uVar23 = pbVar15[uVar22].field_0.field_0.v[2];
          fVar1 = p_Var17[uVar25].field_0.field_0.x;
          fVar2 = p_Var17[uVar25].field_0.field_0.y;
          fVar3 = p_Var17[uVar21].field_0.field_0.x;
          fVar4 = p_Var17[uVar23].field_0.field_0.x;
          fVar5 = p_Var17[uVar21].field_0.field_0.y;
          fVar6 = p_Var17[uVar23].field_0.field_0.y;
          fVar7 = p_Var17[uVar25].field_0.field_0.z;
          fVar8 = p_Var17[uVar21].field_0.field_0.z;
          fVar9 = p_Var17[uVar23].field_0.field_0.z;
          uVar21 = 0xffffffff;
          fVar30 = 3.4028235e+38;
          pbVar20 = pbVar15;
          fVar29 = 3.4028235e+38;
          uVar23 = 0xffffffff;
          do {
            if (((lVar19 == 0) || (uVar25 = pbVar20->tag, uVar25 < uVar10)) ||
               (((int)num_groups + uVar10) - 1 < uVar25)) {
LAB_00128402:
              fVar26 = fVar29;
              uVar25 = uVar23;
            }
            else {
              uVar11 = (pbVar20->field_0).field_0.v[0];
              uVar12 = (pbVar20->field_0).field_0.v[1];
              p_Var17 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
                        super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar13 = (pbVar20->field_0).field_0.v[2];
              fVar27 = (fVar1 + fVar3 + fVar4) * 0.33333334 -
                       (p_Var17[uVar11].field_0.field_0.x + p_Var17[uVar12].field_0.field_0.x +
                       p_Var17[uVar13].field_0.field_0.x) * 0.33333334;
              fVar28 = (fVar2 + fVar5 + fVar6) * 0.33333334 -
                       (p_Var17[uVar11].field_0.field_0.y + p_Var17[uVar12].field_0.field_0.y +
                       p_Var17[uVar13].field_0.field_0.y) * 0.33333334;
              fVar26 = (fVar7 + fVar8 + fVar9) * 0.33333334 -
                       (p_Var17[uVar11].field_0.field_0.z + p_Var17[uVar12].field_0.field_0.z +
                       p_Var17[uVar13].field_0.field_0.z) * 0.33333334;
              fVar26 = fVar26 * fVar26 + fVar27 * fVar27 + fVar28 * fVar28;
              if (fVar26 < 0.0) {
                fVar26 = sqrtf(fVar26);
              }
              else {
                fVar26 = SQRT(fVar26);
              }
              if (fVar26 < fVar30) {
                uVar21 = uVar25;
                fVar30 = fVar26;
              }
              if (((!consider_gamemtl) || (fVar29 <= fVar26)) ||
                 (*(short *)((long)&pbVar20->field_1 + 4) !=
                  *(short *)((long)&pbVar15[uVar22].field_1 + 4))) goto LAB_00128402;
            }
            pbVar20 = pbVar20 + 1;
            lVar19 = lVar19 + -0x40;
            fVar29 = fVar26;
            uVar23 = uVar25;
          } while (pbVar20 != pbVar16);
        }
        ppbVar24 = ppbVar24 + 1;
        if (consider_gamemtl && uVar25 != 0xffffffff) {
          uVar21 = uVar25;
          fVar30 = fVar26;
        }
        uVar22 = (ulong)uVar21;
        xray_re::msg("nearest: %u (%.2f)",SUB84((double)fVar30,0),uVar22);
        ppbVar18 = (this->m_instances).
                   super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->m_instances).
                          super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppbVar18 >> 3) <=
            uVar22) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar22);
        }
        merge(this,ppbVar18[uVar22],&instance1->super_b_model_instance);
        if (instance1 != (b_submesh *)0x0) {
          Opcode::Model::~Model(&instance1->opc_model);
          Opcode::MeshInterface::~MeshInterface(&instance1->opc_mesh);
          operator_delete(instance1,0xe0);
        }
      } while (ppbVar24 != ppbVar14);
    }
    ppbVar24 = (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    ppbVar14 = (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppbVar24 != (pointer)0x0) {
      operator_delete(ppbVar24,(long)ppbVar14 - (long)ppbVar24);
      return;
    }
  }
  return;
}

Assistant:

void level_mesh::merge_orphans(b_submesh_vec& orphans, size_t num_groups, bool consider_gamemtl)
{
	if (orphans.empty())
		return;
	msg("merging %" PRIuSIZET " orphan(s)", orphans.size());
	uint32_t min_tag = m_free_tag, max_tag = min_tag + uint32_t(num_groups & UINT32_MAX) - 1;
	for (b_submesh_vec_it it = orphans.begin(), end = orphans.end(); it != end;) {
		b_submesh* sm = *it++;
		const b_face* face = &m_faces[sm->min_face];
		fvector3 p;
		p.calc_center(m_points[face->v0], m_points[face->v1], m_points[face->v2]);
		uint32_t tag1 = BAD_IDX, tag2 = tag1;
		float min_dist1 = xr_numeric_limits<float>::max(), min_dist2 = min_dist1;
		for (b_face_vec_it it1 = m_faces.begin(), end1 = m_faces.end(); it1 != end1; ++it1) {
			uint32_t tag;
			if ((tag = it1->tag) >= min_tag && tag <= max_tag && face != &*it1) {
				float dist = fvector3().calc_center(m_points[it1->v0], m_points[it1->v1], m_points[it1->v2]).distance(p);
				if (min_dist1 > dist) {
					min_dist1 = dist;
					tag1 = tag;
				}
				if (consider_gamemtl && min_dist2 > dist &&
						it1->surface.gamemtl == face->surface.gamemtl) {
					min_dist2 = dist;
					tag2 = tag;
				}
			}
		}
		if (consider_gamemtl && tag2 != BAD_IDX) {
			tag1 = tag2;
			min_dist1 = min_dist2;
		}
		msg("nearest: %" PRIu32 " (%.2f)", tag1, min_dist1);
		merge(m_instances.at(tag1), sm);
		delete sm;
	}
	b_submesh_vec().swap(orphans);
}